

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# none.hpp
# Opt level: O3

error_code __thiscall
websocketpp::transport::asio::basic_socket::connection::init_asio
          (connection *this,io_service_ptr service,strand_ptr *param_2,bool param_3)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  basic_stream_socket<asio::ip::tcp> *pbVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  undefined7 in_register_00000009;
  undefined8 uVar6;
  error_category *peVar7;
  error_code eVar8;
  undefined1 local_39;
  weak_ptr<void> local_38;
  basic_stream_socket<asio::ip::tcp> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  reference_wrapper<asio::io_context> local_18;
  
  if (this->m_state == UNINITIALIZED) {
    local_28 = (element_type *)0x0;
    local_18._M_data = service;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<asio::basic_stream_socket<asio::ip::tcp>,std::allocator<asio::basic_stream_socket<asio::ip::tcp>>,std::reference_wrapper<asio::io_context>>
              (&_Stack_20,&local_28,
               (allocator<asio::basic_stream_socket<asio::ip::tcp>_> *)&local_39,&local_18);
    _Var4._M_pi = _Stack_20._M_pi;
    pbVar3 = local_28;
    local_28 = (basic_stream_socket<asio::ip::tcp> *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->m_socket).
             super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->m_socket).
    super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = pbVar3;
    (this->m_socket).
    super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      }
    }
    if ((this->m_socket_init_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_38.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->m_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_38.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->m_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      p_Var2 = (this->m_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
          UNLOCK();
          if ((this->m_socket_init_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
        }
        else {
          p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
        }
      }
      (*(this->m_socket_init_handler)._M_invoker)
                ((_Any_data *)&this->m_socket_init_handler,&local_38,
                 (this->m_socket).
                 super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      if (local_38.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_38.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = (local_38.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
          (local_38.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*(local_38.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[3])();
        }
      }
    }
    this->m_state = READY;
    uVar6 = 0;
    peVar7 = (error_category *)std::_V2::system_category();
  }
  else {
    uVar6 = 3;
    peVar7 = (error_category *)&socket::get_socket_category()::instance;
    if (socket::get_socket_category()::instance == '\0') {
      iVar5 = __cxa_guard_acquire(&socket::get_socket_category()::instance,service,param_2,
                                  CONCAT71(in_register_00000009,param_3));
      if (iVar5 != 0) {
        peVar7 = (error_category *)&socket::get_socket_category()::instance;
        __cxa_atexit(std::_V2::error_category::~error_category,
                     &socket::get_socket_category()::instance,&__dso_handle);
        __cxa_guard_release(&socket::get_socket_category()::instance);
      }
    }
  }
  eVar8._M_cat = peVar7;
  eVar8._0_8_ = uVar6;
  return eVar8;
}

Assistant:

lib::error_code init_asio (io_service_ptr service, strand_ptr, bool)
    {
        if (m_state != UNINITIALIZED) {
            return socket::make_error_code(socket::error::invalid_state);
        }

        m_socket = lib::make_shared<lib::asio::ip::tcp::socket>(
            lib::ref(*service));

        if (m_socket_init_handler) {
            m_socket_init_handler(m_hdl, *m_socket);
        }

        m_state = READY;

        return lib::error_code();
    }